

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper::RunImpl
          (acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *this)

{
  Message *pMVar1;
  TestResults *pTVar2;
  byte bVar3;
  bool bVar4;
  TestResults **ppTVar5;
  TestDetails **ppTVar6;
  FieldMap *pFVar7;
  TestDetails local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  undefined1 local_710 [8];
  SendingTime sendingTime;
  OrigSendingTime origSendingTime;
  PossDupFlag possDupFlag;
  ResendRequest local_5d8;
  TestDetails local_460;
  ExecutionReport local_440;
  Message local_2e8 [8];
  Message message;
  UtcTimeStamp local_180;
  Logon local_168;
  acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *local_10;
  acceptorT11FixturenextResendRequestT1150RepeatingGroupHelper *this_local;
  
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  local_10 = this;
  createT11Logon(&local_168,"ISLD","TW",1);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_180);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&local_168,SUB81(&local_180,0));
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_180);
  FIXT11::Logon::~Logon(&local_168);
  createT1150ExecutionReport(&local_440,"ISLD","TW",2);
  FIX::Message::Message(local_2e8,(Message *)&local_440);
  FIX42::ExecutionReport::~ExecutionReport(&local_440);
  bVar3 = FIX::Session::send((Message *)
                             (this->super_acceptorT11Fixture).super_sessionT11Fixture.object);
  bVar4 = UnitTest::Check<bool>((bool)(bVar3 & 1));
  if (!bVar4) {
    ppTVar5 = UnitTest::CurrentTest::Results();
    pTVar2 = *ppTVar5;
    ppTVar6 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_460,*ppTVar6,0x502);
    UnitTest::TestResults::OnTestFailure(pTVar2,&local_460,"object->send( message )");
  }
  pMVar1 = (Message *)(this->super_acceptorT11Fixture).super_sessionT11Fixture.object;
  createT11ResendRequest(&local_5d8,"ISLD","TW",3,2,2);
  FIX::UtcTimeStamp::UtcTimeStamp
            ((UtcTimeStamp *)&possDupFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum);
  FIX::Session::next(pMVar1,(UtcTimeStamp *)&local_5d8,(bool)((char)&possDupFlag + 'X'));
  FIX::UtcTimeStamp::~UtcTimeStamp
            ((UtcTimeStamp *)&possDupFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum);
  FIXT11::ResendRequest::~ResendRequest(&local_5d8);
  FIX::PossDupFlag::PossDupFlag
            ((PossDupFlag *)
             &origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum);
  FIX::OrigSendingTime::OrigSendingTime
            ((OrigSendingTime *)
             &sendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum);
  FIX::SendingTime::SendingTime((SendingTime *)local_710);
  pFVar7 = &FIX::Message::getHeader
                      (&(this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.
                        lastResent)->super_FieldMap;
  FIX::FieldMap::getField
            (pFVar7,(FieldBase *)
                    &origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum);
  pFVar7 = &FIX::Message::getHeader
                      (&(this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.
                        lastResent)->super_FieldMap;
  FIX::FieldMap::getField
            (pFVar7,(FieldBase *)
                    &sendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum);
  pFVar7 = &FIX::Message::getHeader
                      (&(this->super_acceptorT11Fixture).super_sessionT11Fixture.super_TestCallback.
                        lastResent)->super_FieldMap;
  FIX::FieldMap::getField(pFVar7,(FieldBase *)local_710);
  pFVar7 = &FIX::Message::getHeader(local_2e8)->super_FieldMap;
  FIX::FieldMap::setField
            (pFVar7,(FieldBase *)
                    &origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum,
             true);
  pFVar7 = &FIX::Message::getHeader(local_2e8)->super_FieldMap;
  FIX::FieldMap::setField
            (pFVar7,(FieldBase *)
                    &sendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum,true);
  pFVar7 = &FIX::Message::getHeader(local_2e8)->super_FieldMap;
  FIX::FieldMap::setField(pFVar7,(FieldBase *)local_710,true);
  ppTVar5 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar5;
  FIX::Message::toString_abi_cxx11_((int)&local_730,(int)local_2e8,8);
  FIX::Message::toString_abi_cxx11_((int)&local_750,(int)this + 0x70,8);
  ppTVar6 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_770,*ppTVar6,0x50e);
  UnitTest::CheckEqual<std::__cxx11::string,std::__cxx11::string>
            (pTVar2,&local_730,&local_750,&local_770);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_730);
  FIX::SendingTime::~SendingTime((SendingTime *)local_710);
  FIX::OrigSendingTime::~OrigSendingTime
            ((OrigSendingTime *)
             &sendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum);
  FIX::PossDupFlag::~PossDupFlag
            ((PossDupFlag *)
             &origSendingTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum);
  FIX::Message::~Message(local_2e8);
  return;
}

Assistant:

TEST_FIXTURE(acceptorT11Fixture, nextResendRequestT1150RepeatingGroup)
{
  object->next( createT11Logon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  FIX::Message message = createT1150ExecutionReport( "ISLD", "TW", 2 );
  CHECK( object->send( message ) );
  object->next( createT11ResendRequest( "ISLD", "TW", 3, 2, 2 ), UtcTimeStamp() );

  PossDupFlag possDupFlag;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  lastResent.getHeader().getField( possDupFlag );
  lastResent.getHeader().getField( origSendingTime );
  lastResent.getHeader().getField( sendingTime );
  message.getHeader().setField( possDupFlag );
  message.getHeader().setField( origSendingTime );
  message.getHeader().setField( sendingTime );
  CHECK_EQUAL( message.toString(), lastResent.toString() );
}